

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# is_partitioned_suite.cpp
# Opt level: O0

void test_array_boolean(void)

{
  size_type in_RCX;
  initializer_list<trial::dynamic::basic_variable<std::allocator<char>_>_> init;
  basic_variable<std::allocator<char>_> *local_280;
  undefined1 local_272 [2];
  iterator local_270;
  iterator local_258;
  undefined1 local_23c [2];
  undefined1 local_23a [2];
  iterator local_238;
  iterator local_220;
  undefined1 local_204 [2];
  undefined1 local_202 [2];
  iterator local_200;
  iterator local_1e8;
  undefined1 local_1cc [2];
  undefined1 local_1ca [2];
  iterator local_1c8;
  iterator local_1b0;
  undefined1 local_194 [2];
  undefined1 local_192 [2];
  iterator local_190;
  iterator local_178;
  undefined1 local_15c [2];
  undefined1 local_15a [2];
  iterator local_158;
  iterator local_140;
  undefined1 local_124 [2];
  undefined1 local_122 [2];
  iterator local_120;
  iterator local_108;
  undefined1 local_ee [14];
  basic_variable<std::allocator<char>_> *local_e0;
  basic_variable<std::allocator<char>_> local_d8;
  basic_variable<std::allocator<char>_> local_a8;
  basic_variable<std::allocator<char>_> local_78;
  undefined1 local_48 [24];
  variable data;
  
  local_e0 = &local_d8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_e0,true);
  local_e0 = &local_a8;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_e0,false);
  local_e0 = &local_78;
  trial::dynamic::basic_variable<std::allocator<char>_>::basic_variable<bool>(local_e0,true);
  local_48._0_8_ = &local_d8;
  local_48._8_8_ = 3;
  init._M_len = in_RCX;
  init._M_array = (iterator)0x3;
  trial::dynamic::basic_array<std::allocator<char>_>::make
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10),
             (basic_array<std::allocator<char>_> *)local_48._0_8_,init);
  local_280 = (basic_variable<std::allocator<char>_> *)local_48;
  do {
    local_280 = local_280 + -1;
    trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable(local_280);
  } while (local_280 != &local_d8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_108,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_120,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_ee[0] = std::
                is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::boolean>>
                          (&local_108,&local_120);
  local_122[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<boolean>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/is_partitioned_suite.cpp"
             ,0x79,"void test_array_boolean()",local_ee,local_122);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_120);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_108);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_140,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_158,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_124[0] = std::
                 is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::integer>>
                           (&local_140,&local_158);
  local_15a[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<integer>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/is_partitioned_suite.cpp"
             ,0x7a,"void test_array_boolean()",local_124,local_15a);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_158);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_140);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_178,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_190,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_15c[0] = std::
                 is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::real>>
                           (&local_178,&local_190);
  local_192[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<real>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/is_partitioned_suite.cpp"
             ,0x7b,"void test_array_boolean()",local_15c,local_192);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_190);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_178);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1b0,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_1c8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_194[0] = std::
                 is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::string>>
                           (&local_1b0,&local_1c8);
  local_1ca[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<string>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/is_partitioned_suite.cpp"
             ,0x7c,"void test_array_boolean()",local_194,local_1ca);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1c8);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1b0);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_1e8,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_200,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_1cc[0] = std::
                 is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::wstring>>
                           (&local_1e8,&local_200);
  local_202[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<wstring>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/is_partitioned_suite.cpp"
             ,0x7d,"void test_array_boolean()",local_1cc,local_202);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_200);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_1e8);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_220,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_238,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_204[0] = std::
                 is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::u16string>>
                           (&local_220,&local_238);
  local_23a[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<u16string>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/is_partitioned_suite.cpp"
             ,0x7e,"void test_array_boolean()",local_204,local_23a);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_238);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_220);
  trial::dynamic::basic_variable<std::allocator<char>_>::begin
            (&local_258,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  trial::dynamic::basic_variable<std::allocator<char>_>::end
            (&local_270,(basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  local_23c[0] = std::
                 is_partitioned<trial::dynamic::basic_variable<std::allocator<char>>::iterator,trial::dynamic::is<trial::dynamic::u32string>>
                           (&local_258,&local_270);
  local_272[0] = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,bool,bool>
            ("std::is_partitioned(data.begin(), data.end(), is<u32string>())","true",
             "/workspace/llm4binary/github/license_c_cmakelists/breese[P]trial/test/dynamic/std/is_partitioned_suite.cpp"
             ,0x7f,"void test_array_boolean()",local_23c,local_272);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_270);
  trial::dynamic::basic_variable<std::allocator<char>_>::iterator::~iterator(&local_258);
  trial::dynamic::basic_variable<std::allocator<char>_>::~basic_variable
            ((basic_variable<std::allocator<char>_> *)(local_48 + 0x10));
  return;
}

Assistant:

void test_array_boolean()
{
    variable data = array::make({ true, false, true });
    TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<boolean>()), true);
    TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<integer>()), true);
    TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<real>()), true);
    TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<string>()), true);
    TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<wstring>()), true);
    TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<u16string>()), true);
    TRIAL_PROTOCOL_TEST_EQUAL(std::is_partitioned(data.begin(), data.end(), is<u32string>()), true);
}